

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

int64_t __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_int64_value
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  bool bVar1;
  type_conflict3 tVar2;
  type_conflict4 tVar3;
  uint8_t *first;
  ssize_t sVar4;
  type_conflict2 tVar5;
  uint64_t uVar6;
  ulong uVar7;
  error_code *in_RSI;
  long in_RDI;
  uint64_t x_3;
  type_conflict2 x_2;
  uint8_t buf_2 [8];
  type_conflict4 x_1;
  uint8_t buf_1 [4];
  type_conflict3 x;
  uint8_t buf [2];
  uint8_t b;
  uint8_t info;
  cbor_major_type major_type;
  char_result<unsigned_char> ch;
  int64_t val;
  size_t in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  cbor_errc __e;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  cbor_major_type cVar8;
  error_code *in_stack_ffffffffffffffb0;
  uint64_t uVar9;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined1 local_3c [14];
  undefined1 local_2e [7];
  undefined1 local_27 [2];
  byte local_25;
  byte local_24;
  cbor_major_type local_23;
  char_result<unsigned_char> local_22;
  uint64_t local_20;
  error_code *local_18;
  uint64_t local_8;
  
  __e = (cbor_errc)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_20 = 0;
  local_18 = in_RSI;
  local_22 = bytes_source::peek((bytes_source *)(in_RDI + 0x30));
  if (((ushort)local_22 & 0x100) == 0) {
    local_23 = get_major_type(local_22.value);
    local_24 = get_additional_information_value(local_22.value);
    if (local_23 == unsigned_integer) {
      uVar6 = get_uint64_value(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      bVar1 = std::error_code::operator_cast_to_bool(local_18);
      if (bVar1) {
        return 0;
      }
      uVar9 = uVar6;
      uVar7 = std::numeric_limits<long>::max();
      if (uVar6 <= uVar7) {
        local_20 = uVar9;
      }
    }
    else if (local_23 == negative_integer) {
      cVar8 = local_23;
      bytes_source::ignore((bytes_source *)(in_RDI + 0x30),1);
      first = (uint8_t *)(ulong)local_24;
      switch(first) {
      case (uint8_t *)0x0:
      case (uint8_t *)0x1:
      case (uint8_t *)0x2:
      case (uint8_t *)0x3:
      case (uint8_t *)0x4:
      case (uint8_t *)0x5:
      case (uint8_t *)0x6:
      case (uint8_t *)0x7:
      case (uint8_t *)0x8:
      case (uint8_t *)0x9:
      case (uint8_t *)0xa:
      case (uint8_t *)0xb:
      case (uint8_t *)0xc:
      case (uint8_t *)0xd:
      case (uint8_t *)0xe:
      case (uint8_t *)0xf:
      case (uint8_t *)0x10:
      case (uint8_t *)0x11:
      case (uint8_t *)0x12:
      case (uint8_t *)0x13:
      case (uint8_t *)0x14:
      case (uint8_t *)0x15:
      case (uint8_t *)0x16:
      case (uint8_t *)0x17:
        local_20 = (uint64_t)(char)(-1 - local_24);
        break;
      case (uint8_t *)0x18:
        sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)&local_25,(void *)0x1,
                                   0xeb45b0);
        if (sVar4 == 0) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar8,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return local_20;
        }
        local_20 = -(ulong)local_25 - 1;
        break;
      case (uint8_t *)0x19:
        sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)local_27,(void *)0x2,
                                   0xeb45b0);
        if (sVar4 != 2) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar8,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return local_20;
        }
        tVar2 = binary::big_to_native<unsigned_short,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -(ulong)tVar2 - 1;
        break;
      case (uint8_t *)0x1a:
        sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)local_2e,(void *)0x4,
                                   0xeb45b0);
        if (sVar4 != 4) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar8,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return local_20;
        }
        tVar3 = binary::big_to_native<unsigned_int,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -(ulong)tVar3 - 1;
        break;
      case (uint8_t *)0x1b:
        sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)local_3c,(void *)0x8,
                                   0xeb45b0);
        if (sVar4 != 8) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar8,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          *(undefined1 *)(in_RDI + 8) = 0;
          return local_20;
        }
        tVar5 = binary::big_to_native<unsigned_long,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -tVar5 - 1;
      }
    }
    local_8 = local_20;
  }
  else {
    std::error_code::operator=
              ((error_code *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),__e);
    *(undefined1 *)(in_RDI + 8) = 0;
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }